

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O2

int mp_check_exact(char **data,char *end)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  mp_check_error err;
  
  pcVar1 = *data;
  iVar2 = mp_check(data,end);
  iVar3 = 1;
  if (iVar2 == 0) {
    err.pos = *data;
    if (err.pos == end) {
      iVar3 = 0;
    }
    else {
      err.type = MP_CHECK_ERROR_JUNK;
      err.data = pcVar1;
      err.end = end;
      (*mp_check_on_error)(&err);
    }
  }
  return iVar3;
}

Assistant:

MP_IMPL int
mp_check_exact(const char **data, const char *end)
{
	const char *begin = *data;
	if (mp_check(data, end) != 0)
		return 1;
	if (*data != end) {
		struct mp_check_error err;
		err.type = MP_CHECK_ERROR_JUNK;
		err.data = begin;
		err.end = end;
		err.pos = *data;
		mp_check_on_error(&err);
		return 1;
	}
	return 0;
}